

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Internal::connect_proof_tracer
          (Internal *this,Tracer *tracer,bool antecedents,bool finalize_clauses)

{
  byte bVar1;
  byte bVar2;
  undefined4 in_ECX;
  socklen_t __len;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  Internal *in_RSI;
  Internal *in_RDI;
  undefined6 in_stack_ffffffffffffffe8;
  
  __len = CONCAT31((int3)((uint)in_ECX >> 8),in_DL) & 0xffffff01;
  bVar2 = (byte)__len;
  bVar1 = (byte)in_ECX & 1;
  new_proof_on_demand(in_RSI);
  if ((bVar2 & 1) != 0) {
    force_lrat(in_RDI);
  }
  if ((bVar1 & 1) != 0) {
    in_RDI->frat = true;
  }
  resize_unit_clauses_idx(in_RSI);
  Proof::connect(in_RDI->proof,(int)in_RSI,(sockaddr *)CONCAT71(extraout_var,extraout_DL),__len);
  std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::push_back
            ((vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *)in_RSI,
             (value_type *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
  return;
}

Assistant:

void Internal::connect_proof_tracer (Tracer *tracer, bool antecedents,
                                     bool finalize_clauses) {
  new_proof_on_demand ();
  if (antecedents)
    force_lrat ();
  if (finalize_clauses)
    frat = true;
  resize_unit_clauses_idx ();
  proof->connect (tracer);
  tracers.push_back (tracer);
}